

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O3

void QItemSelection::split
               (QItemSelectionRange *range,QItemSelectionRange *other,QItemSelection *result)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  QAbstractItemModel *pQVar8;
  QAbstractItemModel *pQVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  uint local_c4;
  QItemSelectionRange local_a8;
  QModelIndex local_98;
  QModelIndex local_78;
  undefined8 local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QPersistentModelIndex::parent((QModelIndex *)&local_58,&range->tl);
  QPersistentModelIndex::parent(&local_78,&other->tl);
  if (((((int)local_58 == local_78.r) && (local_58._4_4_ == local_78.c)) &&
      (puStack_50 == (undefined1 *)CONCAT44(local_78.i._4_4_,(undefined4)local_78.i))) &&
     (local_48.ptr == local_78.m.ptr)) {
    pQVar8 = QPersistentModelIndex::model(&range->tl);
    pQVar9 = QPersistentModelIndex::model(&other->tl);
    if (pQVar8 == pQVar9) {
      local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      QPersistentModelIndex::parent((QModelIndex *)&local_58,&other->tl);
      uVar1 = QPersistentModelIndex::row(&range->tl);
      uVar2 = QPersistentModelIndex::column(&range->tl);
      local_c4 = QPersistentModelIndex::row(&range->br);
      uVar3 = QPersistentModelIndex::column(&range->br);
      uVar4 = QPersistentModelIndex::row(&other->tl);
      iVar5 = QPersistentModelIndex::column(&other->tl);
      uVar6 = QPersistentModelIndex::row(&other->br);
      iVar7 = QPersistentModelIndex::column(&other->br);
      pQVar8 = QPersistentModelIndex::model(&range->tl);
      uVar10 = (ulong)uVar1;
      if ((int)uVar1 < (int)uVar4) {
        local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_78.r = -0x55555556;
        local_78.c = -0x55555556;
        local_78.i._0_4_ = 0xaaaaaaaa;
        local_78.i._4_4_ = 0xaaaaaaaa;
        (*(pQVar8->super_QObject)._vptr_QObject[0xc])(&local_78,pQVar8,uVar10,(ulong)uVar2);
        local_98.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_98.r = -0x55555556;
        local_98.c = -0x55555556;
        local_98.i._0_4_ = 0xaaaaaaaa;
        local_98.i._4_4_ = 0xaaaaaaaa;
        (*(pQVar8->super_QObject)._vptr_QObject[0xc])
                  (&local_98,pQVar8,(ulong)(uVar4 - 1),(ulong)uVar3,&local_58);
        QItemSelectionRange::QItemSelectionRange(&local_a8,&local_78,&local_98);
        QtPrivate::QMovableArrayOps<QItemSelectionRange>::emplace<QItemSelectionRange>
                  ((QMovableArrayOps<QItemSelectionRange> *)result,
                   (result->super_QList<QItemSelectionRange>).d.size,&local_a8);
        QList<QItemSelectionRange>::end(&result->super_QList<QItemSelectionRange>);
        QPersistentModelIndex::~QPersistentModelIndex(&local_a8.br);
        QPersistentModelIndex::~QPersistentModelIndex(&local_a8.tl);
        uVar10 = (ulong)uVar4;
      }
      if ((int)uVar6 < (int)local_c4) {
        local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_78.r = -0x55555556;
        local_78.c = -0x55555556;
        local_78.i._0_4_ = 0xaaaaaaaa;
        local_78.i._4_4_ = 0xaaaaaaaa;
        (*(pQVar8->super_QObject)._vptr_QObject[0xc])
                  (&local_78,pQVar8,(ulong)(uVar6 + 1),(ulong)uVar2,&local_58);
        local_98.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_98.r = -0x55555556;
        local_98.c = -0x55555556;
        local_98.i._0_4_ = 0xaaaaaaaa;
        local_98.i._4_4_ = 0xaaaaaaaa;
        (*(pQVar8->super_QObject)._vptr_QObject[0xc])
                  (&local_98,pQVar8,(ulong)local_c4,(ulong)uVar3,&local_58);
        QItemSelectionRange::QItemSelectionRange(&local_a8,&local_78,&local_98);
        QtPrivate::QMovableArrayOps<QItemSelectionRange>::emplace<QItemSelectionRange>
                  ((QMovableArrayOps<QItemSelectionRange> *)result,
                   (result->super_QList<QItemSelectionRange>).d.size,&local_a8);
        QList<QItemSelectionRange>::end(&result->super_QList<QItemSelectionRange>);
        QPersistentModelIndex::~QPersistentModelIndex(&local_a8.br);
        QPersistentModelIndex::~QPersistentModelIndex(&local_a8.tl);
        local_c4 = uVar6;
      }
      if ((int)uVar2 < iVar5) {
        local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_78.r = -0x55555556;
        local_78.c = -0x55555556;
        local_78.i._0_4_ = 0xaaaaaaaa;
        local_78.i._4_4_ = 0xaaaaaaaa;
        (*(pQVar8->super_QObject)._vptr_QObject[0xc])
                  (&local_78,pQVar8,uVar10,(ulong)uVar2,&local_58);
        local_98.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_98.r = -0x55555556;
        local_98.c = -0x55555556;
        local_98.i._0_4_ = 0xaaaaaaaa;
        local_98.i._4_4_ = 0xaaaaaaaa;
        (*(pQVar8->super_QObject)._vptr_QObject[0xc])
                  (&local_98,pQVar8,(ulong)local_c4,(ulong)(iVar5 - 1),&local_58);
        QItemSelectionRange::QItemSelectionRange(&local_a8,&local_78,&local_98);
        QtPrivate::QMovableArrayOps<QItemSelectionRange>::emplace<QItemSelectionRange>
                  ((QMovableArrayOps<QItemSelectionRange> *)result,
                   (result->super_QList<QItemSelectionRange>).d.size,&local_a8);
        QList<QItemSelectionRange>::end(&result->super_QList<QItemSelectionRange>);
        QPersistentModelIndex::~QPersistentModelIndex(&local_a8.br);
        QPersistentModelIndex::~QPersistentModelIndex(&local_a8.tl);
      }
      if (iVar7 < (int)uVar3) {
        local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_78.r = -0x55555556;
        local_78.c = -0x55555556;
        local_78.i._0_4_ = 0xaaaaaaaa;
        local_78.i._4_4_ = 0xaaaaaaaa;
        (*(pQVar8->super_QObject)._vptr_QObject[0xc])
                  (&local_78,pQVar8,uVar10,(ulong)(iVar7 + 1),&local_58);
        local_98.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_98.r = -0x55555556;
        local_98.c = -0x55555556;
        local_98.i._0_4_ = 0xaaaaaaaa;
        local_98.i._4_4_ = 0xaaaaaaaa;
        (*(pQVar8->super_QObject)._vptr_QObject[0xc])
                  (&local_98,pQVar8,(ulong)local_c4,(ulong)uVar3,&local_58);
        QItemSelectionRange::QItemSelectionRange(&local_a8,&local_78,&local_98);
        QtPrivate::QMovableArrayOps<QItemSelectionRange>::emplace<QItemSelectionRange>
                  ((QMovableArrayOps<QItemSelectionRange> *)result,
                   (result->super_QList<QItemSelectionRange>).d.size,&local_a8);
        QList<QItemSelectionRange>::end(&result->super_QList<QItemSelectionRange>);
        QPersistentModelIndex::~QPersistentModelIndex(&local_a8.br);
        QPersistentModelIndex::~QPersistentModelIndex(&local_a8.tl);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QItemSelection::split(const QItemSelectionRange &range,
                           const QItemSelectionRange &other, QItemSelection *result)
{
    if (range.parent() != other.parent() || range.model() != other.model())
        return;

    QModelIndex parent = other.parent();
    int top = range.top();
    int left = range.left();
    int bottom = range.bottom();
    int right = range.right();
    int other_top = other.top();
    int other_left = other.left();
    int other_bottom = other.bottom();
    int other_right = other.right();
    const QAbstractItemModel *model = range.model();
    Q_ASSERT(model);
    if (other_top > top) {
        QModelIndex tl = model->index(top, left, parent);
        QModelIndex br = model->index(other_top - 1, right, parent);
        result->append(QItemSelectionRange(tl, br));
        top = other_top;
    }
    if (other_bottom < bottom) {
        QModelIndex tl = model->index(other_bottom + 1, left, parent);
        QModelIndex br = model->index(bottom, right, parent);
        result->append(QItemSelectionRange(tl, br));
        bottom = other_bottom;
    }
    if (other_left > left) {
        QModelIndex tl = model->index(top, left, parent);
        QModelIndex br = model->index(bottom, other_left - 1, parent);
        result->append(QItemSelectionRange(tl, br));
        left = other_left;
    }
    if (other_right < right) {
        QModelIndex tl = model->index(top, other_right + 1, parent);
        QModelIndex br = model->index(bottom, right, parent);
        result->append(QItemSelectionRange(tl, br));
        right = other_right;
    }
}